

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite_correlated_expressions.cpp
# Opt level: O2

void __thiscall
duckdb::RewriteCorrelatedRecursive::VisitExpression
          (RewriteCorrelatedRecursive *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expression)

{
  ExpressionType EVar1;
  long lVar2;
  idx_t iVar3;
  pointer pEVar4;
  BoundColumnRefExpression *pBVar5;
  iterator iVar6;
  BoundSubqueryExpression *pBVar7;
  type binder;
  type subquery;
  
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expression);
  EVar1 = (pEVar4->super_BaseExpression).type;
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expression);
  if (EVar1 == BOUND_COLUMN_REF) {
    pBVar5 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&pEVar4->super_BaseExpression);
    if (pBVar5->depth == 0) {
      return;
    }
    iVar6 = ::std::
            _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&this->correlated_map->_M_h,&pBVar5->binding);
    if (iVar6.super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_true>
        ._M_cur != (__node_type *)0x0) {
      lVar2 = *(long *)((long)iVar6.
                              super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_true>
                              ._M_cur + 0x18);
      iVar3 = (this->base_binding).column_index;
      (pBVar5->binding).table_index = (this->base_binding).table_index;
      (pBVar5->binding).column_index = lVar2 + iVar3;
      pBVar5->depth = pBVar5->depth - 1;
    }
  }
  else if ((pEVar4->super_BaseExpression).type == SUBQUERY) {
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(expression);
    pBVar7 = BaseExpression::Cast<duckdb::BoundSubqueryExpression>(&pEVar4->super_BaseExpression);
    binder = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar7->binder);
    subquery = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
               ::operator*(&pBVar7->subquery);
    RewriteCorrelatedSubquery(this,binder,subquery);
  }
  BoundNodeVisitor::VisitExpression(&this->super_BoundNodeVisitor,expression);
  return;
}

Assistant:

void RewriteCorrelatedRecursive::VisitExpression(unique_ptr<Expression> &expression) {
	if (expression->GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
		// bound column reference
		auto &bound_colref = expression->Cast<BoundColumnRefExpression>();
		if (bound_colref.depth == 0) {
			// not a correlated column, ignore
			return;
		}
		// correlated column
		// check the correlated map
		auto entry = correlated_map.find(bound_colref.binding);
		if (entry != correlated_map.end()) {
			// we found the column in the correlated map!
			// update the binding and reduce the depth by 1
			bound_colref.binding = ColumnBinding(base_binding.table_index, base_binding.column_index + entry->second);
			bound_colref.depth--;
		}
	} else if (expression->GetExpressionType() == ExpressionType::SUBQUERY) {
		// we encountered another subquery: rewrite recursively
		auto &bound_subquery = expression->Cast<BoundSubqueryExpression>();
		RewriteCorrelatedSubquery(*bound_subquery.binder, *bound_subquery.subquery);
	}
	// recurse into the children of this subquery
	BoundNodeVisitor::VisitExpression(expression);
}